

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

NetworkUpdateParameters *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::NetworkUpdateParameters>
          (Arena *arena)

{
  NetworkUpdateParameters *this;
  
  if (arena == (Arena *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this,(Arena *)0x0,false)
    ;
  }
  else {
    this = (NetworkUpdateParameters *)
           AllocateAlignedWithHook
                     (arena,0x50,
                      (type_info *)&CoreML::Specification::NetworkUpdateParameters::typeinfo);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }